

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_deletable_handle_graph.cpp
# Opt level: O0

handle_t __thiscall
handlegraph::MutablePathDeletableHandleGraph::change_sequence
          (MutablePathDeletableHandleGraph *this,handle_t *handle,string *sequence)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  handle_t hVar4;
  undefined8 in_RDX;
  long *plVar5;
  undefined8 in_RSI;
  long *in_RDI;
  handle_t *handle_00;
  HandleGraph *this_00;
  undefined1 auVar6 [16];
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> rewriter;
  step_handle_t *step;
  iterator __end1;
  iterator __begin1;
  vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_> *__range1;
  vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_> steps;
  handle_t new_handle;
  vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>
  *in_stack_fffffffffffffe68;
  __normal_iterator<handlegraph::step_handle_t_*,_std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>_>
  *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffe80;
  reference in_stack_fffffffffffffe88;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  anon_class_24_3_60728404 *in_stack_fffffffffffffeb8;
  PathHandleGraph *in_stack_fffffffffffffec0;
  HandleGraph *in_stack_fffffffffffffed0;
  undefined1 local_101 [32];
  undefined1 local_e1 [16];
  undefined8 local_d0;
  char local_c8 [8];
  undefined1 local_c0 [24];
  reference local_a8;
  step_handle_t *local_a0;
  __normal_iterator<handlegraph::step_handle_t_*,_std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 *local_78;
  undefined1 local_70 [32];
  undefined8 local_50;
  char *local_48;
  char local_40 [8];
  char *local_30;
  char local_28 [8];
  undefined8 local_18;
  char local_8 [8];
  
  local_18 = in_RSI;
  local_8 = (char  [8])
            (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x1d0)) + 0xa0))
                      ((long)in_RDI + *(long *)(*in_RDI + -0x1d0),in_RDX);
  handle_00 = (handle_t *)((long)in_RDI + *(long *)(*in_RDI + -0xb0));
  local_28 = (char  [8])
             HandleGraph::forward
                       ((HandleGraph *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)
                        ,(handle_t *)in_stack_fffffffffffffe70);
  local_30 = local_8;
  HandleGraph::
  follow_edges<handlegraph::MutablePathDeletableHandleGraph::change_sequence(handlegraph::handle_t_const&,std::__cxx11::string_const&)::__0>
            (in_stack_fffffffffffffed0,handle_00,SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0),
             (anon_class_16_2_9c5f9a22 *)in_stack_fffffffffffffeb8);
  this_00 = (HandleGraph *)((long)in_RDI + *(long *)(*in_RDI + -0xb0));
  local_40 = (char  [8])
             HandleGraph::forward
                       ((HandleGraph *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)
                        ,(handle_t *)in_stack_fffffffffffffe70);
  local_50 = local_18;
  local_48 = local_8;
  HandleGraph::
  follow_edges<handlegraph::MutablePathDeletableHandleGraph::change_sequence(handlegraph::handle_t_const&,std::__cxx11::string_const&)::__1>
            (this_00,handle_00,SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0),
             in_stack_fffffffffffffeb8);
  std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>::vector
            ((vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_> *)
             0x201123);
  local_78 = local_70;
  PathHandleGraph::
  for_each_step_on_handle<handlegraph::MutablePathDeletableHandleGraph::change_sequence(handlegraph::handle_t_const&,std::__cxx11::string_const&)::__2>
            (in_stack_fffffffffffffec0,(handle_t *)in_stack_fffffffffffffeb8,
             (anon_class_8_1_a8a4c247 *)
             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  local_90 = local_70;
  local_98._M_current =
       (step_handle_t *)
       std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>::begin
                 (in_stack_fffffffffffffe68);
  local_a0 = (step_handle_t *)
             std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>::
             end(in_stack_fffffffffffffe68);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe70,
                       (__normal_iterator<handlegraph::step_handle_t_*,_std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar2) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<handlegraph::step_handle_t_*,_std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>_>
               ::operator*(&local_98);
    lVar1 = *(long *)(*in_RDI + -0x168);
    plVar5 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0xb0));
    local_d0 = (**(code **)(*(long *)((long)in_RDI + lVar1) + 0xd8))((long)in_RDI + lVar1,local_a8);
    bVar3 = (**(code **)(*plVar5 + 0x28))(plVar5,&local_d0);
    if ((bVar3 & 1) == 0) {
      local_c8[0] = local_8[0];
      local_c8[1] = local_8[1];
      local_c8[2] = local_8[2];
      local_c8[3] = local_8[3];
      local_c8[4] = local_8[4];
      local_c8[5] = local_8[5];
      local_c8[6] = local_8[6];
      local_c8[7] = local_8[7];
    }
    else {
      local_c8 = (char  [8])
                 (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb0)) + 0x30))
                           ((long)in_RDI + *(long *)(*in_RDI + -0xb0),local_8);
    }
    std::allocator<handlegraph::handle_t>::allocator((allocator<handlegraph::handle_t> *)0x2012a1);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
              (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88,
               (value_type *)in_stack_fffffffffffffe80,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    std::allocator<handlegraph::handle_t>::~allocator((allocator<handlegraph::handle_t> *)0x2012cf);
    lVar1 = *(long *)(*in_RDI + -0x168);
    in_stack_fffffffffffffe80 =
         (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
         ((long)in_RDI + *(long *)(*in_RDI + -0x1c8));
    in_stack_fffffffffffffe88 = local_a8;
    auVar6 = (**(code **)(*(long *)((long)in_RDI + lVar1) + 0x118))((long)in_RDI + lVar1);
    in_stack_fffffffffffffe90 = auVar6._8_8_;
    local_e1 = auVar6;
    (**(code **)(in_stack_fffffffffffffe80->
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                _M_impl.super__Vector_impl_data._M_start[0x31].data)
              (local_101,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,local_e1,local_c0);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
              (in_stack_fffffffffffffe80);
    __gnu_cxx::
    __normal_iterator<handlegraph::step_handle_t_*,_std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>_>
    ::operator++(&local_98);
  }
  bVar3 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb0)) + 0x28))
                    ((long)in_RDI + *(long *)(*in_RDI + -0xb0),local_18);
  if ((bVar3 & 1) != 0) {
    local_8 = (char  [8])
              (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb0)) + 0x30))
                        ((long)in_RDI + *(long *)(*in_RDI + -0xb0),local_8);
  }
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x1e0)) + 0xf8))
            ((long)in_RDI + *(long *)(*in_RDI + -0x1e0),local_18);
  std::vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>::~vector
            ((vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_> *)
             in_stack_fffffffffffffe80);
  hVar4.data[0] = local_8[0];
  hVar4.data[1] = local_8[1];
  hVar4.data[2] = local_8[2];
  hVar4.data[3] = local_8[3];
  hVar4.data[4] = local_8[4];
  hVar4.data[5] = local_8[5];
  hVar4.data[6] = local_8[6];
  hVar4.data[7] = local_8[7];
  return (handle_t)hVar4.data;
}

Assistant:

handle_t MutablePathDeletableHandleGraph::change_sequence(const handle_t& handle,
                                                          const std::string& sequence) {
    // TODO: repetitive with DeletableHandleGraph, but we can't call it because it could destroy
    // all the paths containing the handle as a side effect of the destroy_handle call at the end
    
    // new handle with the new sequence
    handle_t new_handle = create_handle(sequence);
    // copy its edges
    follow_edges(forward(handle), false, [&](const handle_t& next) {
        create_edge(new_handle, next);
    });
    follow_edges(forward(handle), true, [&](const handle_t& prev) {
        // ensure that we don't double add a non-reversing self-edge
        if (get_id(prev) != get_id(handle) || get_is_reverse(prev)) {
            create_edge(prev, new_handle);
        }
    });
    
    // collect the steps we need to replace
    std::vector<step_handle_t> steps;
    for_each_step_on_handle(handle, [&](const step_handle_t& step) {
        steps.push_back(step);
    });
    
    // replace them
    for (const auto& step : steps) {
        std::vector<handle_t> rewriter(1, get_is_reverse(get_handle_of_step(step)) ? flip(new_handle) : new_handle);
        rewrite_segment(step, get_next_step(step), rewriter);
    }
    if (get_is_reverse(handle)) {
        new_handle = flip(new_handle);
    }
    
    // clear the original
    destroy_handle(handle);
    
    return new_handle;
}